

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickup.c
# Opt level: O0

int invo_obj_compare(void *o1,void *o2)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  char *pos2;
  char *pos1;
  obj *obj2;
  obj *obj1;
  void *o2_local;
  void *o1_local;
  
  lVar1 = *o2;
  pcVar2 = strchr(flags.inv_order,(int)*(char *)(*o1 + 0x35));
  pcVar3 = strchr(flags.inv_order,(int)*(char *)(lVar1 + 0x35));
  if (pcVar2 == pcVar3) {
    o1_local._4_4_ = 0;
  }
  else {
    o1_local._4_4_ = (int)pcVar2 - (int)pcVar3;
  }
  return o1_local._4_4_;
}

Assistant:

static int invo_obj_compare(const void *o1, const void *o2)
{
	struct obj *obj1 = *(struct obj**)o1;
	struct obj *obj2 = *(struct obj**)o2;

	/* compare positions in inv_order */
	char *pos1 = strchr(flags.inv_order, obj1->oclass);
	char *pos2 = strchr(flags.inv_order, obj2->oclass);
	if (pos1 != pos2)
	    return pos1 - pos2;

	return 0;
}